

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockNodeMoveChildNodes(ImGuiDockNode *dst_node,ImGuiDockNode *src_node)

{
  ImGuiDockNode *pIVar1;
  ImGuiDockNode *pIVar2;
  
  if ((dst_node->Windows).Size == 0) {
    pIVar1 = src_node->ChildNodes[0];
    dst_node->ChildNodes[0] = pIVar1;
    pIVar2 = src_node->ChildNodes[1];
    dst_node->ChildNodes[1] = pIVar2;
    if (pIVar1 != (ImGuiDockNode *)0x0) {
      pIVar1->ParentNode = dst_node;
      pIVar2 = dst_node->ChildNodes[1];
    }
    if (pIVar2 != (ImGuiDockNode *)0x0) {
      pIVar2->ParentNode = dst_node;
    }
    dst_node->SplitAxis = src_node->SplitAxis;
    dst_node->SizeRef = src_node->SizeRef;
    src_node->ChildNodes[0] = (ImGuiDockNode *)0x0;
    src_node->ChildNodes[1] = (ImGuiDockNode *)0x0;
    return;
  }
  __assert_fail("dst_node->Windows.Size == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x3547,"void ImGui::DockNodeMoveChildNodes(ImGuiDockNode *, ImGuiDockNode *)");
}

Assistant:

static void ImGui::DockNodeMoveChildNodes(ImGuiDockNode* dst_node, ImGuiDockNode* src_node)
{
    IM_ASSERT(dst_node->Windows.Size == 0);
    dst_node->ChildNodes[0] = src_node->ChildNodes[0];
    dst_node->ChildNodes[1] = src_node->ChildNodes[1];
    if (dst_node->ChildNodes[0])
        dst_node->ChildNodes[0]->ParentNode = dst_node;
    if (dst_node->ChildNodes[1])
        dst_node->ChildNodes[1]->ParentNode = dst_node;
    dst_node->SplitAxis = src_node->SplitAxis;
    dst_node->SizeRef = src_node->SizeRef;
    src_node->ChildNodes[0] = src_node->ChildNodes[1] = NULL;
}